

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O2

void test_with_0<wchar_t>(void)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  runtime_error *prVar5;
  allocator local_ba;
  allocator local_b9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  string a;
  
  a._M_dataplus._M_p = (pointer)&a.field_2;
  a.field_2._M_allocated_capacity = 0x7a79200000636261;
  a.field_2._8_2_ = 0;
  a._M_string_length = 9;
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_58,"UTF-8",&local_b9);
  booster::locale::conv::to_utf<wchar_t>(&local_b8,&a,&local_58,default_method);
  std::__cxx11::string::string((string *)&local_78,"UTF-8",&local_ba);
  booster::locale::conv::from_utf<wchar_t>(&local_98,&local_b8,&local_78,default_method);
  _Var3 = std::operator==(&local_98,&a);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x104);
    poVar4 = std::operator<<(poVar4,
                             " booster::locale::conv::from_utf<Char>(booster::locale::conv::to_utf<Char>(a,\"UTF-8\"),\"UTF-8\") == a"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_98,"Error limits reached, stopping unit test",
                 (allocator *)&local_b8);
      booster::runtime_error::runtime_error(prVar5,&local_98);
      __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_58,"ISO8859-1",&local_b9);
  booster::locale::conv::to_utf<wchar_t>(&local_b8,&a,&local_58,default_method);
  std::__cxx11::string::string((string *)&local_78,"ISO8859-1",&local_ba);
  booster::locale::conv::from_utf<wchar_t>(&local_98,&local_b8,&local_78,default_method);
  _Var3 = std::operator==(&local_98,&a);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x105);
    poVar4 = std::operator<<(poVar4,
                             " booster::locale::conv::from_utf<Char>(booster::locale::conv::to_utf<Char>(a,\"ISO8859-1\"),\"ISO8859-1\") == a"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_98,"Error limits reached, stopping unit test",
                 (allocator *)&local_b8);
      booster::runtime_error::runtime_error(prVar5,&local_98);
      __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)&a);
  return;
}

Assistant:

void test_to_neg(std::string source,std::basic_string<Char> target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l=g("en_US."+encoding);

    TEST(to_utf<Char>(source,encoding)==target);
    TEST(to_utf<Char>(source.c_str(),encoding)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    TEST(to_utf<Char>(source,l)==target);
    TEST(to_utf<Char>(source.c_str(),l)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TESTF(to_utf<Char>(source,encoding,stop));
    TESTF(to_utf<Char>(source.c_str(),encoding,stop));
    TESTF(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop));
    TESTF(to_utf<Char>(source,l,stop));
    TESTF(to_utf<Char>(source.c_str(),l,stop));
    TESTF(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop));
}